

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

void __thiscall apngasm::APNGAsm::~APNGAsm(APNGAsm *this)

{
  reset(this);
  std::_Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::~_Vector_base
            (&(this->_info_chunks).
              super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>);
  std::_Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::~_Vector_base
            ((_Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_> *)this);
  return;
}

Assistant:

APNGAsm::~APNGAsm()
  {
    reset();
  }